

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O1

void Curl_conncache_remove_conn(conncache *connc,connectdata *conn)

{
  connectbundle *pcVar1;
  curl_hash_element *pcVar2;
  curl_llist_element *e;
  curl_hash_iterator iter;
  curl_hash_iterator local_30;
  
  pcVar1 = conn->bundle;
  if (pcVar1 != (connectbundle *)0x0) {
    e = (pcVar1->conn_list).head;
    if (e != (curl_llist_element *)0x0) {
      do {
        if ((connectdata *)e->ptr == conn) {
          Curl_llist_remove(&pcVar1->conn_list,e,(void *)0x0);
          pcVar1->num_connections = pcVar1->num_connections - 1;
          conn->bundle = (connectbundle *)0x0;
          break;
        }
        e = e->next;
      } while (e != (curl_llist_element *)0x0);
    }
    if ((pcVar1->num_connections == 0) && (connc != (conncache *)0x0)) {
      Curl_hash_start_iterate(&connc->hash,&local_30);
      pcVar2 = Curl_hash_next_element(&local_30);
      if (pcVar2 != (curl_hash_element *)0x0) {
        do {
          if ((connectbundle *)pcVar2->ptr == pcVar1) {
            Curl_hash_delete(&connc->hash,pcVar2->key,pcVar2->key_len);
            break;
          }
          pcVar2 = Curl_hash_next_element(&local_30);
        } while (pcVar2 != (curl_hash_element *)0x0);
      }
    }
    if (connc != (conncache *)0x0) {
      connc->num_connections = connc->num_connections - 1;
    }
  }
  return;
}

Assistant:

void Curl_conncache_remove_conn(struct conncache *connc,
                                struct connectdata *conn)
{
  struct connectbundle *bundle = conn->bundle;

  /* The bundle pointer can be NULL, since this function can be called
     due to a failed connection attempt, before being added to a bundle */
  if(bundle) {
    bundle_remove_conn(bundle, conn);
    if(bundle->num_connections == 0) {
      conncache_remove_bundle(connc, bundle);
    }

    if(connc) {
      connc->num_connections--;

      DEBUGF(infof(conn->data, "The cache now contains %"
                   CURL_FORMAT_CURL_OFF_TU " members\n",
                   (curl_off_t) connc->num_connections));
    }
  }
}